

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_BuildInFunctionPrintDefined_Test::
~SemanticAnalyserTest_BuildInFunctionPrintDefined_Test
          (SemanticAnalyserTest_BuildInFunctionPrintDefined_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, BuildInFunctionPrintDefined)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    print("test");
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}